

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Gemm_x86_avx::forward
          (Gemm_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  size_t sVar2;
  const_reference pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  float *pfVar7;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  Option *in_stack_00000048;
  int i_1;
  int size_1;
  Mat *B_3;
  Mat *A_3;
  Mat *A_2;
  Mat *B_2;
  int in_stack_00000268;
  int ret;
  int _nT;
  Mat *top_blob;
  size_t out_elemsize;
  int outh;
  int out_elempack;
  int i;
  int size;
  Mat C2;
  int in_stack_00000340;
  int in_stack_00000348;
  int in_stack_00000350;
  int in_stack_00000358;
  int in_stack_00000360;
  int in_stack_00000368;
  Option *in_stack_00000370;
  int broadcast_type_C;
  Mat C;
  Mat *B_1;
  Mat *A_1;
  Mat *A;
  Mat *B;
  int N;
  int M;
  undefined4 in_stack_fffffffffffff760;
  int in_stack_fffffffffffff764;
  undefined4 in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  undefined4 in_stack_fffffffffffff770;
  int in_stack_fffffffffffff774;
  undefined8 in_stack_fffffffffffff778;
  int _w;
  Mat *in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  bool local_801;
  int local_800;
  int local_7fc;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  int local_678;
  int local_64c;
  int local_62c;
  int local_628;
  Mat *local_620;
  Mat *local_618;
  Mat *local_610;
  undefined4 local_608;
  Mat *local_600;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  undefined8 local_5e0;
  Mat local_5d8;
  Mat local_590;
  Mat *local_548;
  Mat *local_540;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  Mat *pMVar8;
  undefined8 uVar9;
  int iVar10;
  undefined4 uVar11;
  Mat *in_stack_fffffffffffffad0;
  Mat *in_stack_fffffffffffffad8;
  Mat *in_stack_fffffffffffffae0;
  Mat *in_stack_fffffffffffffae8;
  int local_510;
  size_t local_508;
  Mat *local_500;
  Mat *local_4f8;
  Mat *local_4f0;
  int local_4e8;
  Mat *local_4e0;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  size_t local_4c0;
  int in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 uVar12;
  Mat *C_00;
  Mat *BT;
  Mat *A_00;
  int local_488;
  Mat *local_480;
  int local_478;
  int local_474;
  int local_470;
  int local_468;
  size_t local_460;
  int local_438;
  int local_434;
  int local_40c;
  Mat **in_stack_fffffffffffffc38;
  Mat *in_stack_fffffffffffffc40;
  Mat *in_stack_fffffffffffffc48;
  Mat *in_stack_fffffffffffffc50;
  Mat *in_stack_fffffffffffffc58;
  Mat **in_stack_fffffffffffffcd0;
  Mat *in_stack_fffffffffffffcd8;
  Mat *in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  Mat *in_stack_fffffffffffffcf0;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  Mat *in_stack_ffffffffffffff58;
  
  uVar9 = CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8);
  if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0)) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) {
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
        pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
          if (pvVar5->dims == 3) {
            local_698 = pvVar5->c;
          }
          else {
            local_698 = pvVar5->h;
          }
          local_694 = local_698 * pvVar5->elempack;
        }
        else {
          local_694 = pvVar5->w;
        }
        local_434 = local_694;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0) {
          local_6a0 = pvVar3->w;
        }
        else {
          if (pvVar3->dims == 3) {
            local_69c = pvVar3->c;
          }
          else {
            local_69c = pvVar3->h;
          }
          local_6a0 = local_69c * pvVar3->elempack;
        }
        local_438 = local_6a0;
      }
      else {
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
          if (pvVar5->dims == 3) {
            local_690 = pvVar5->c;
          }
          else {
            local_690 = pvVar5->h;
          }
          local_68c = local_690 * pvVar5->elempack;
        }
        else {
          local_68c = pvVar5->w;
        }
        local_434 = local_68c;
        local_438 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
      }
    }
    else {
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
      local_434 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0) {
        local_688 = pvVar5->w;
      }
      else {
        if (pvVar5->dims == 3) {
          local_684 = pvVar5->c;
        }
        else {
          local_684 = pvVar5->h;
        }
        local_688 = local_684 * pvVar5->elempack;
      }
      local_438 = local_688;
    }
  }
  else {
    local_434 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
    local_438 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
  }
  C_00 = (Mat *)0x0;
  BT = (Mat *)0x0;
  A_00 = (Mat *)0x0;
  local_488 = 0;
  local_480 = (Mat *)0x0;
  local_478 = 0;
  local_474 = 0;
  local_470 = 0;
  local_468 = 0;
  local_460 = 0;
  uVar12 = 0;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0) {
    if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) ||
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0)) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) {
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
          if (sVar4 == 3) {
            pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,2);
            local_5d8.data = pvVar5->data;
            local_5d8.refcount = pvVar5->refcount;
            local_5d8.elemsize = pvVar5->elemsize;
            local_5d8.elempack = pvVar5->elempack;
            local_5d8.allocator = pvVar5->allocator;
            local_5d8.dims = pvVar5->dims;
            local_5d8.w = pvVar5->w;
            local_5d8.h = pvVar5->h;
            local_5d8.d = pvVar5->d;
            local_5d8.c = pvVar5->c;
            local_5d8.cstep = pvVar5->cstep;
            if ((Mat *)local_5d8.refcount != (Mat *)0x0) {
              LOCK();
              *(int *)&((Mat *)local_5d8.refcount)->data =
                   *(int *)&((Mat *)local_5d8.refcount)->data + 1;
              UNLOCK();
            }
          }
          else {
            local_5d8.data = (Mat *)0x0;
            local_5d8.refcount = (int *)0x0;
            local_5d8.elemsize = 0;
            local_5d8.elempack = 0;
            local_5d8.allocator = (Allocator *)0x0;
            local_5d8.dims = 0;
            local_5d8.w = 0;
            local_5d8.h = 0;
            local_5d8.d = 0;
            local_5d8.c = 0;
            local_5d8.cstep = 0;
          }
          if ((Mat *)&stack0xfffffffffffffb60 != &local_5d8) {
            if ((Mat *)local_5d8.refcount != (Mat *)0x0) {
              LOCK();
              *(int *)(void **)local_5d8.refcount = *(int *)(void **)local_5d8.refcount + 1;
              UNLOCK();
            }
            if (BT != (Mat *)0x0) {
              LOCK();
              iVar10 = *(int *)&BT->data;
              *(int *)&BT->data = *(int *)&BT->data + -1;
              UNLOCK();
              if (iVar10 == 1) {
                if (C_00 != (Mat *)0x0) {
                  free(C_00);
                }
                in_stack_ffffffffffffff28 = (int)C_00;
              }
            }
            local_488 = local_5d8.elempack;
            local_480 = (Mat *)local_5d8.allocator;
            local_478 = local_5d8.dims;
            local_474 = local_5d8.w;
            local_470 = local_5d8.h;
            local_468 = local_5d8.c;
            local_460 = local_5d8.cstep;
            C_00 = (Mat *)local_5d8.data;
            BT = (Mat *)local_5d8.refcount;
            A_00 = (Mat *)local_5d8.elemsize;
          }
          in_stack_fffffffffffffc58 = &local_5d8;
          in_stack_fffffffffffffcf0 = in_stack_fffffffffffffc58;
          if ((Mat *)local_5d8.refcount != (Mat *)0x0) {
            in_stack_fffffffffffffcec = 0xffffffff;
            LOCK();
            in_stack_fffffffffffffce8 = *(int *)(void **)local_5d8.refcount;
            *(int *)(void **)local_5d8.refcount = *(int *)(void **)local_5d8.refcount + -1;
            UNLOCK();
            if (in_stack_fffffffffffffce8 == 1) {
              if ((Mat *)local_5d8.allocator == (Mat *)0x0) {
                if ((Mat *)local_5d8.data != (Mat *)0x0) {
                  free(local_5d8.data);
                }
              }
              else {
                (*(local_5d8.allocator)->_vptr_Allocator[3])(local_5d8.allocator,local_5d8.data);
              }
            }
          }
          local_5d8.data = (void *)0x0;
          local_5d8.elemsize = 0;
          local_5d8.elempack = 0;
          local_5d8.dims = 0;
          local_5d8.w = 0;
          local_5d8.h = 0;
          local_5d8.d = 0;
          local_5d8.c = 0;
          local_5d8.cstep = 0;
          local_5d8.refcount = (int *)0x0;
        }
        else {
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
          if (sVar4 == 2) {
            pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
            local_590.data = pvVar5->data;
            local_590.refcount = pvVar5->refcount;
            local_590.elemsize = pvVar5->elemsize;
            local_590.elempack = pvVar5->elempack;
            local_590.allocator = pvVar5->allocator;
            local_590.dims = pvVar5->dims;
            local_590.w = pvVar5->w;
            local_590.h = pvVar5->h;
            local_590.d = pvVar5->d;
            local_590.c = pvVar5->c;
            local_590.cstep = pvVar5->cstep;
            if ((Mat *)local_590.refcount != (Mat *)0x0) {
              LOCK();
              *(int *)&((Mat *)local_590.refcount)->data =
                   *(int *)&((Mat *)local_590.refcount)->data + 1;
              UNLOCK();
            }
          }
          else {
            local_590.data = (Mat *)0x0;
            local_590.refcount = (int *)0x0;
            local_590.elemsize = 0;
            local_590.elempack = 0;
            local_590.allocator = (Allocator *)0x0;
            local_590.dims = 0;
            local_590.w = 0;
            local_590.h = 0;
            local_590.d = 0;
            local_590.c = 0;
            local_590.cstep = 0;
          }
          if ((Mat *)&stack0xfffffffffffffb60 != &local_590) {
            if ((Mat *)local_590.refcount != (Mat *)0x0) {
              LOCK();
              *(int *)(void **)local_590.refcount = *(int *)(void **)local_590.refcount + 1;
              UNLOCK();
            }
            if (BT != (Mat *)0x0) {
              LOCK();
              iVar10 = *(int *)&BT->data;
              *(int *)&BT->data = *(int *)&BT->data + -1;
              UNLOCK();
              if (iVar10 == 1) {
                if (C_00 != (Mat *)0x0) {
                  free(C_00);
                }
                in_stack_ffffffffffffff20 = (int)C_00;
              }
            }
            local_488 = local_590.elempack;
            local_480 = (Mat *)local_590.allocator;
            local_478 = local_590.dims;
            local_474 = local_590.w;
            local_470 = local_590.h;
            local_468 = local_590.c;
            local_460 = local_590.cstep;
            C_00 = (Mat *)local_590.data;
            BT = (Mat *)local_590.refcount;
            A_00 = (Mat *)local_590.elemsize;
          }
          in_stack_fffffffffffffc48 = &local_590;
          if ((Mat *)local_590.refcount != (Mat *)0x0) {
            LOCK();
            iVar10 = *(int *)(void **)local_590.refcount;
            *(int *)(void **)local_590.refcount = *(int *)(void **)local_590.refcount + -1;
            UNLOCK();
            if (iVar10 == 1) {
              if ((Mat *)local_590.allocator == (Mat *)0x0) {
                in_stack_ffffffffffffff58 = (Mat *)local_590.data;
                if ((Mat *)local_590.data != (Mat *)0x0) {
                  free(local_590.data);
                  in_stack_ffffffffffffff58 = (Mat *)local_590.data;
                }
              }
              else {
                (*(local_590.allocator)->_vptr_Allocator[3])(local_590.allocator,local_590.data);
              }
            }
          }
          local_590.data = (void *)0x0;
          local_590.elemsize = 0;
          local_590.elempack = 0;
          local_590.dims = 0;
          local_590.w = 0;
          local_590.h = 0;
          local_590.d = 0;
          local_590.c = 0;
          local_590.cstep = 0;
          local_590.refcount = (int *)0x0;
        }
      }
      else {
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
        if (sVar4 == 2) {
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
          local_548 = (Mat *)pvVar5->data;
          local_540 = (Mat *)pvVar5->refcount;
          pMVar8 = (Mat *)pvVar5->elemsize;
          iVar10 = pvVar5->elempack;
          in_stack_fffffffffffffad8 = (Mat *)pvVar5->allocator;
          iVar10 = pvVar5->dims;
          iVar10 = pvVar5->w;
          iVar10 = pvVar5->h;
          iVar10 = pvVar5->d;
          local_510 = pvVar5->c;
          local_508 = pvVar5->cstep;
          if (local_540 != (Mat *)0x0) {
            LOCK();
            *(int *)&local_540->data = *(int *)&local_540->data + 1;
            UNLOCK();
          }
        }
        else {
          local_548 = (Mat *)0x0;
          local_540 = (Mat *)0x0;
          pMVar8 = (Mat *)0x0;
          uVar11 = 0;
          in_stack_fffffffffffffad8 = (Mat *)0x0;
          uVar11 = 0;
          uVar11 = 0;
          uVar11 = 0;
          uVar11 = 0;
          local_510 = 0;
          local_508 = 0;
        }
        if ((Mat **)&stack0xfffffffffffffb60 != &local_548) {
          if (local_540 != (Mat *)0x0) {
            LOCK();
            *(int *)&local_540->data = *(int *)&local_540->data + 1;
            UNLOCK();
          }
          A_00 = pMVar8;
          if (BT != (Mat *)0x0) {
            LOCK();
            iVar10 = *(int *)&BT->data;
            *(int *)&BT->data = *(int *)&BT->data + -1;
            UNLOCK();
            if ((iVar10 == 1) && (C_00 != (Mat *)0x0)) {
              free(C_00);
              A_00 = pMVar8;
            }
          }
          local_488 = (int)in_stack_fffffffffffffad0;
          local_478 = (int)in_stack_fffffffffffffae0;
          local_474 = (int)((ulong)in_stack_fffffffffffffae0 >> 0x20);
          local_470 = (int)in_stack_fffffffffffffae8;
          local_468 = local_510;
          local_460 = local_508;
          C_00 = local_548;
          BT = local_540;
          local_480 = in_stack_fffffffffffffad8;
        }
        in_stack_fffffffffffffc38 = &local_548;
        if (local_540 != (Mat *)0x0) {
          LOCK();
          iVar10 = *(int *)&local_540->data;
          *(int *)&local_540->data = *(int *)&local_540->data + -1;
          UNLOCK();
          if (iVar10 == 1) {
            if (in_stack_fffffffffffffad8 == (Mat *)0x0) {
              if (local_548 != (Mat *)0x0) {
                free(local_548);
              }
              in_stack_ffffffffffffff48 = (int)local_548;
            }
            else {
              (**(_func_int **)((long)in_stack_fffffffffffffad8->data + 0x18))
                        (in_stack_fffffffffffffad8,local_548);
            }
          }
        }
        local_548 = (Mat *)0x0;
        uVar9 = 0;
        uVar11 = 0;
        uVar11 = 0;
        uVar11 = 0;
        local_540 = (Mat *)0x0;
      }
    }
    else {
      sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
      if (sVar4 == 1) {
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
        local_500 = (Mat *)pvVar5->data;
        local_4f8 = (Mat *)pvVar5->refcount;
        local_4f0 = (Mat *)pvVar5->elemsize;
        local_4e8 = pvVar5->elempack;
        local_4e0 = (Mat *)pvVar5->allocator;
        local_4d8 = pvVar5->dims;
        local_4d4 = pvVar5->w;
        local_4d0 = pvVar5->h;
        local_4cc = pvVar5->d;
        local_4c8 = pvVar5->c;
        local_4c0 = pvVar5->cstep;
        if (local_4f8 != (Mat *)0x0) {
          LOCK();
          *(int *)&local_4f8->data = *(int *)&local_4f8->data + 1;
          UNLOCK();
        }
      }
      else {
        local_500 = (Mat *)0x0;
        local_4f8 = (Mat *)0x0;
        local_4f0 = (Mat *)0x0;
        local_4e8 = 0;
        local_4e0 = (Mat *)0x0;
        local_4d8 = 0;
        local_4d4 = 0;
        local_4d0 = 0;
        local_4cc = 0;
        local_4c8 = 0;
        local_4c0 = 0;
      }
      if ((Mat **)&stack0xfffffffffffffb60 != &local_500) {
        if (local_4f8 != (Mat *)0x0) {
          LOCK();
          *(int *)&local_4f8->data = *(int *)&local_4f8->data + 1;
          UNLOCK();
        }
        if (BT != (Mat *)0x0) {
          LOCK();
          iVar10 = *(int *)&BT->data;
          *(int *)&BT->data = *(int *)&BT->data + -1;
          UNLOCK();
          if ((iVar10 == 1) && (C_00 != (Mat *)0x0)) {
            free(C_00);
          }
        }
        local_488 = local_4e8;
        local_480 = local_4e0;
        local_478 = local_4d8;
        local_474 = local_4d4;
        local_470 = local_4d0;
        local_468 = local_4c8;
        local_460 = local_4c0;
        C_00 = local_500;
        BT = local_4f8;
        A_00 = local_4f0;
      }
      if (local_4f8 != (Mat *)0x0) {
        LOCK();
        iVar10 = *(int *)&local_4f8->data;
        *(int *)&local_4f8->data = *(int *)&local_4f8->data + -1;
        UNLOCK();
        if (iVar10 == 1) {
          if (local_4e0 == (Mat *)0x0) {
            if (local_500 != (Mat *)0x0) {
              free(local_500);
            }
            in_stack_ffffffffffffff38 = (int)local_500;
          }
          else {
            (**(_func_int **)((long)local_4e0->data + 0x18))(local_4e0,local_500);
          }
        }
      }
      local_500 = (Mat *)0x0;
      local_4f0 = (Mat *)0x0;
      local_4e8 = 0;
      local_4d8 = 0;
      local_4d4 = 0;
      local_4d0 = 0;
      local_4cc = 0;
      local_4c8 = 0;
      local_4c0 = 0;
      local_4f8 = (Mat *)0x0;
    }
    if (C_00 != (Mat *)0x0 && local_460 * (long)local_468 != 0) {
      if ((local_478 == 1) && (local_474 == 1)) {
        uVar12 = 0;
      }
      if ((local_478 == 1) && (local_474 * local_488 == local_434)) {
        uVar12 = 1;
      }
      if ((local_478 == 1) && (local_474 * local_488 == local_438)) {
        uVar12 = 4;
      }
      if (((local_478 == 2) && (local_474 == 1)) && (local_470 * local_488 == local_434)) {
        uVar12 = 2;
      }
      if (((local_478 == 2) && (local_474 == local_438)) && (local_470 * local_488 == local_434)) {
        uVar12 = 3;
      }
      if (((local_478 == 2) && (local_474 == local_438)) && (local_470 * local_488 == 1)) {
        uVar12 = 4;
      }
      fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      if ((fVar1 != 1.0) || (NAN(fVar1))) {
        local_620 = (Mat *)0x0;
        local_618 = (Mat *)0x0;
        local_610 = (Mat *)0x0;
        local_608 = 0;
        local_600 = (Mat *)0x0;
        local_5f8 = 0;
        local_5f4 = 0;
        local_5f0 = 0;
        local_5ec = 0;
        local_5e8 = 0;
        local_5e0 = 0;
        Mat::create_like((Mat *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                         (Mat *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                         (Allocator *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760))
        ;
        for (local_628 = 0; local_628 < (int)local_460 * local_468 * local_488;
            local_628 = local_628 + 1) {
          *(float *)((long)&local_620->data + (long)local_628 * 4) =
               *(float *)((long)&C_00->data + (long)local_628 * 4) *
               *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        }
        if ((Mat **)&stack0xfffffffffffffb60 != &local_620) {
          if (local_618 != (Mat *)0x0) {
            LOCK();
            *(int *)&local_618->data = *(int *)&local_618->data + 1;
            UNLOCK();
          }
          if (BT != (Mat *)0x0) {
            LOCK();
            iVar10 = *(int *)&BT->data;
            *(int *)&BT->data = *(int *)&BT->data + -1;
            UNLOCK();
            if (iVar10 == 1) {
              if (local_480 == (Mat *)0x0) {
                if (C_00 != (Mat *)0x0) {
                  free(C_00);
                }
                in_stack_ffffffffffffff30 = (int)C_00;
              }
              else {
                (**(_func_int **)((long)local_480->data + 0x18))(local_480,C_00);
              }
            }
          }
          local_480 = local_600;
          C_00 = local_620;
          BT = local_618;
          A_00 = local_610;
        }
        in_stack_fffffffffffffcd0 = &local_620;
        if (local_618 != (Mat *)0x0) {
          LOCK();
          iVar10 = *(int *)&local_618->data;
          *(int *)&local_618->data = *(int *)&local_618->data + -1;
          UNLOCK();
          if (iVar10 == 1) {
            if (local_600 == (Mat *)0x0) {
              if (local_620 != (Mat *)0x0) {
                free(local_620);
              }
            }
            else {
              (**(_func_int **)((long)local_600->data + 0x18))(local_600,local_620);
            }
          }
        }
        local_620 = (Mat *)0x0;
        local_610 = (Mat *)0x0;
        local_608 = 0;
        local_5f8 = 0;
        local_5f4 = 0;
        local_5f0 = 0;
        local_5ec = 0;
        local_5e8 = 0;
        local_5e0 = 0;
        local_618 = (Mat *)0x0;
      }
    }
  }
  else {
    if ((long *)&stack0xfffffffffffffb60 != in_RDI + 0x14) {
      if (in_RDI[0x15] != 0) {
        LOCK();
        *(int *)in_RDI[0x15] = *(int *)in_RDI[0x15] + 1;
        UNLOCK();
      }
      C_00 = (Mat *)in_RDI[0x14];
      BT = (Mat *)in_RDI[0x15];
      A_00 = (Mat *)in_RDI[0x16];
      local_480 = (Mat *)in_RDI[0x18];
    }
    uVar12 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8);
  }
  local_62c = 1;
  if ((*(byte *)(in_RCX + 0x27) & 1) != 0) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) == 0) {
      local_7fc = local_434;
    }
    else {
      local_7fc = local_438;
    }
    if (local_7fc % 8 == 0) {
      local_800 = 8;
    }
    else {
      local_800 = 1;
      if (local_7fc % 4 == 0) {
        local_800 = 4;
      }
    }
    local_62c = local_800;
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) != 0) {
    local_62c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100);
  }
  pvVar6 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  iVar10 = (int)in_stack_fffffffffffff778;
  _w = (int)((ulong)in_stack_fffffffffffff778 >> 0x20);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) == 0) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc) == 0) {
      Mat::create(in_stack_fffffffffffff780,_w,iVar10,
                  CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                  in_stack_fffffffffffff76c,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    }
    else {
      Mat::create(in_stack_fffffffffffff780,_w,iVar10,in_stack_fffffffffffff774,
                  CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                  in_stack_fffffffffffff764,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
    }
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc) == 0) {
    Mat::create(in_stack_fffffffffffff780,_w,iVar10,
                CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                in_stack_fffffffffffff76c,
                (Allocator *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  }
  else {
    Mat::create(in_stack_fffffffffffff780,_w,iVar10,in_stack_fffffffffffff774,
                CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                in_stack_fffffffffffff764,
                (Allocator *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  }
  local_801 = true;
  if (pvVar6->data != (void *)0x0) {
    local_801 = pvVar6->cstep * (long)pvVar6->c == 0;
  }
  if (local_801) {
    local_40c = -100;
  }
  else {
    if (((int)in_RDI[1] != 0) && (*(int *)(in_RCX + 4) != (int)in_RDI[1])) {
      fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d",
              (ulong)*(uint *)(in_RCX + 4),(ulong)*(uint *)(in_RDI + 1));
      fprintf(_stderr,"\n");
    }
    if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) ||
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0)) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0) {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
          local_64c = gemm_x86(in_stack_fffffffffffffcf0,
                               (Mat *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                               in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                               (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                               (int)in_stack_fffffffffffffcd0,in_stack_00000340,in_stack_00000348,
                               in_stack_00000350,in_stack_00000358,in_stack_00000360,
                               in_stack_00000368,in_stack_00000370);
        }
        else {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
          local_64c = gemm_BT_x86(A_00,BT,C_00,(Mat *)CONCAT44(uVar12,in_stack_fffffffffffffb58),
                                  in_stack_fffffffffffffb54,in_stack_fffffffffffffb50,
                                  in_stack_00000010,in_stack_00000018,in_stack_00000020,
                                  in_stack_00000028,in_stack_00000030,in_stack_00000038,
                                  in_stack_00000040,in_stack_00000048);
        }
      }
      else {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
        local_64c = gemm_AT_x86(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                                in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                                (int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                                (int)in_stack_fffffffffffffc38,i_1,(int)B_3,(int)A_3,(int)A_2,
                                (int)B_2,in_stack_00000268,_nT,(Option *)top_blob);
      }
    }
    else {
      local_64c = gemm_AT_BT_x86(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                                 in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                                 (int)((ulong)uVar9 >> 0x20),(int)uVar9,in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                                 in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
                                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,
                                 (Option *)in_stack_ffffffffffffff58);
    }
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    if ((fVar1 != 1.0) || (NAN(fVar1))) {
      sVar2 = pvVar6->cstep;
      iVar10 = pvVar6->c;
      for (local_678 = 0; local_678 < (int)sVar2 * iVar10 * local_62c; local_678 = local_678 + 1) {
        pfVar7 = (float *)((long)pvVar6->data + (long)local_678 * 4);
        *pfVar7 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * *pfVar7;
      }
    }
    local_40c = local_64c;
  }
  if (BT != (Mat *)0x0) {
    LOCK();
    iVar10 = *(int *)&BT->data;
    *(int *)&BT->data = *(int *)&BT->data + -1;
    UNLOCK();
    if (iVar10 == 1) {
      if (local_480 == (Mat *)0x0) {
        if (C_00 != (Mat *)0x0) {
          free(C_00);
        }
      }
      else {
        (**(_func_int **)((long)local_480->data + 0x18))(local_480,C_00);
      }
    }
  }
  return local_40c;
}

Assistant:

int Gemm_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return ret;
}